

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::LightHandle::PDF_Le
          (LightHandle *this,Interaction *intr,Vector3f *w,Float *pdfPos,Float *pdfDir)

{
  anon_class_32_4_38b71870 func;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Float **in_RDI;
  anon_class_32_4_38b71870 pdf;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_28;
  
  func.w = (Vector3f *)in_RDX;
  func.intr = (Interaction *)in_RCX;
  func.pdfPos = (Float **)in_RSI;
  func.pdfDir = in_RDI;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  ::
  Dispatch<pbrt::LightHandle::PDF_Le(pbrt::Interaction_const&,pbrt::Vector3<float>&,float*,float*)const::__0>
            (&local_28,func);
  return;
}

Assistant:

void LightHandle::PDF_Le(const Interaction &intr, Vector3f &w, Float *pdfPos,
                         Float *pdfDir) const {
    auto pdf = [&](auto ptr) { return ptr->PDF_Le(intr, w, pdfPos, pdfDir); };
    return Dispatch(pdf);
}